

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# der.c
# Opt level: O3

size_t derTOCTDec2(octet *val,octet *der,size_t count,u32 tag,size_t len)

{
  ulong uVar1;
  size_t sVar2;
  ulong uVar3;
  u32 t;
  size_t l;
  u32 local_3c;
  size_t local_38;
  
  sVar2 = derTLDec(&local_3c,&local_38,der,count);
  if (sVar2 == 0xffffffffffffffff) {
    uVar3 = 0xffffffffffffffff;
  }
  else {
    uVar1 = local_38 + sVar2;
    uVar3 = 0xffffffffffffffff;
    if ((local_38 == len && ((local_3c == tag && uVar1 != 0xffffffffffffffff) && uVar1 <= count)) &&
       (uVar3 = uVar1, val != (octet *)0x0)) {
      memMove(val,der + sVar2,len);
    }
  }
  return uVar3;
}

Assistant:

size_t derTOCTDec2(octet* val, const octet der[], size_t count, u32 tag,
	size_t len)
{
	const octet* v;
	count = derDec3(&v, der, count, tag, len);
	if (count == SIZE_MAX)
		return SIZE_MAX;
	if (val)
		memMove(val, v, len);
	return count;
}